

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-intrusive-list.cc
# Opt level: O0

void __thiscall
IntrusiveListTest_size_empty_Test::IntrusiveListTest_size_empty_Test
          (IntrusiveListTest_size_empty_Test *this)

{
  IntrusiveListTest_size_empty_Test *this_local;
  
  anon_unknown.dwarf_4f553::IntrusiveListTest::IntrusiveListTest(&this->super_IntrusiveListTest);
  (this->super_IntrusiveListTest).super_Test._vptr_Test =
       (_func_int **)&PTR__IntrusiveListTest_size_empty_Test_005c3778;
  return;
}

Assistant:

TEST_F(IntrusiveListTest, size_empty) {
  TestObjectList list;
  ASSERT_EQ(0U, list.size());
  ASSERT_TRUE(list.empty());

  list.emplace_back(1);
  ASSERT_EQ(1U, list.size());
  ASSERT_FALSE(list.empty());
}